

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

boolean encode_one_block(working_state *state,JCOEFPTR block,int last_dc_val,c_derived_tbl *dctbl,
                        c_derived_tbl *actbl)

{
  byte bVar1;
  ulong uVar2;
  undefined1 uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  boolean bVar7;
  ulong uVar8;
  long in_RCX;
  int in_EDX;
  short *in_RSI;
  long *in_RDI;
  uint *in_R8;
  size_t bytestocopy;
  size_t bytes;
  int r;
  int localbuf;
  JOCTET *buffer;
  JOCTET _buffer [512];
  bit_buf_type put_buffer;
  int free_bits;
  int nbits;
  int temp;
  working_state *in_stack_fffffffffffffd88;
  size_t local_270;
  ulong local_260;
  int local_258;
  undefined1 *local_250;
  undefined1 local_248 [512];
  ulong local_48;
  int local_3c;
  uint local_38;
  uint local_34;
  uint *local_30;
  short *local_18;
  long *local_10;
  
  uVar2 = in_RDI[1];
  if (0x1ff < uVar2) {
    local_250 = (undefined1 *)*in_RDI;
  }
  else {
    local_250 = local_248;
  }
  uVar4 = *in_RSI - in_EDX >> 0x1f;
  uVar5 = uVar4 + (*in_RSI - in_EDX);
  bVar1 = ""[(int)(uVar5 ^ uVar4)];
  local_38 = (uint)bVar1;
  local_34 = *(int *)(in_RCX + (long)(int)local_38 * 4) << (bVar1 & 0x1f) |
             uVar5 & (int)(1L << (bVar1 & 0x3f)) - 1U;
  local_38 = (int)*(char *)(in_RCX + 0x400 + (long)(int)local_38) + local_38;
  local_3c = (int)in_RDI[3] - local_38;
  local_30 = in_R8;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (local_3c < 0) {
    local_48 = in_RDI[2] << ((byte)local_38 + (char)local_3c & 0x3f) |
               (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
    uVar3 = (undefined1)(local_48 >> 0x38);
    if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0)
    {
      *local_250 = uVar3;
      local_250[1] = (char)(local_48 >> 0x30);
      local_250[2] = (char)(local_48 >> 0x28);
      local_250[3] = (char)(local_48 >> 0x20);
      local_250[4] = (char)(local_48 >> 0x18);
      local_250[5] = (char)(local_48 >> 0x10);
      local_250[6] = (char)(local_48 >> 8);
      local_250[7] = (char)local_48;
      local_250 = local_250 + 8;
    }
    else {
      *local_250 = uVar3;
      local_250[1] = 0;
      local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
      *local_250 = (char)(local_48 >> 0x30);
      local_250[1] = 0;
      local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
      *local_250 = (char)(local_48 >> 0x28);
      local_250[1] = 0;
      local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
      *local_250 = (char)(local_48 >> 0x20);
      local_250[1] = 0;
      local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
      *local_250 = (char)(local_48 >> 0x18);
      local_250[1] = 0;
      local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
      *local_250 = (char)(local_48 >> 0x10);
      local_250[1] = 0;
      local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
      *local_250 = (char)(local_48 >> 8);
      local_250[1] = 0;
      local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
      *local_250 = (char)local_48;
      local_250[1] = 0;
      local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
    }
    local_3c = local_3c + 0x40;
    local_48 = (ulong)(int)local_34;
  }
  else {
    local_48 = in_RDI[2] << ((byte)local_38 & 0x3f) | (long)(int)local_34;
  }
  local_258 = 0;
  iVar6 = (int)local_18[1];
  if (iVar6 == 0) {
    local_258 = 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[8];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x10];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[9];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[2];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[3];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[10];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x11];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x18];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x20];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x19];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x12];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0xb];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[4];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[5];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0xc];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x13];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x1a];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x21];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x28];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x30];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x29];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x22];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x1b];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x14];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0xd];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[6];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[7];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0xe];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x15];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x1c];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x23];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x2a];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x31];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x38];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x39];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x32];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x2b];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x24];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x1d];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x16];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0xf];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x17];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x1e];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x25];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x2c];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x33];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x3a];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x3b];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x34];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x2d];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x26];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x1f];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x27];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x2e];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x35];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x3c];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x3d];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x36];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x2f];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x37];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x3e];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  iVar6 = (int)local_18[0x3f];
  if (iVar6 == 0) {
    local_258 = local_258 + 0x10;
    local_34 = 0;
  }
  else {
    local_34 = (iVar6 >> 0x1f) + iVar6;
    local_38 = (uint)""[(int)(local_34 ^ iVar6 >> 0x1f)];
    while (0xff < local_258) {
      local_258 = local_258 + -0x100;
      local_3c = local_3c - (char)local_30[0x13c];
      if (local_3c < 0) {
        uVar8 = local_48 << ((char)local_30[0x13c] + (char)local_3c & 0x3fU);
        local_48 = uVar8 | local_30[0xf0] >> (-(char)local_3c & 0x1fU);
        uVar3 = (undefined1)(uVar8 >> 0x38);
        if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) ==
            0) {
          *local_250 = uVar3;
          local_250[1] = (char)(local_48 >> 0x30);
          local_250[2] = (char)(local_48 >> 0x28);
          local_250[3] = (char)(local_48 >> 0x20);
          local_250[4] = (char)(local_48 >> 0x18);
          local_250[5] = (char)(local_48 >> 0x10);
          local_250[6] = (char)(local_48 >> 8);
          local_250[7] = (char)local_48;
          local_250 = local_250 + 8;
        }
        else {
          *local_250 = uVar3;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
          *local_250 = (char)(local_48 >> 0x30);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x28);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x20);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x18);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 0x10);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
          *local_250 = (char)(local_48 >> 8);
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
          *local_250 = (char)local_48;
          local_250[1] = 0;
          local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
        }
        local_3c = local_3c + 0x40;
        local_48 = (ulong)local_30[0xf0];
      }
      else {
        local_48 = local_48 << ((byte)local_30[0x13c] & 0x3f) | (ulong)local_30[0xf0];
      }
    }
    local_34 = local_30[(int)(local_38 + local_258)] << ((byte)local_38 & 0x1f) |
               local_34 & (int)(1L << ((byte)local_38 & 0x3f)) - 1U;
    local_38 = (int)*(char *)((long)local_30 + (long)(int)(local_38 + local_258) + 0x400) + local_38
    ;
    local_3c = local_3c - local_38;
    if (local_3c < 0) {
      local_48 = local_48 << ((byte)local_38 + (char)local_3c & 0x3f) |
                 (long)((int)local_34 >> (-(char)local_3c & 0x1fU));
      uVar3 = (undefined1)(local_48 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)(int)local_34;
    }
    else {
      local_48 = local_48 << ((byte)local_38 & 0x3f) | (long)(int)local_34;
    }
    local_258 = 0;
  }
  if (0 < local_258) {
    local_3c = local_3c - (char)local_30[0x100];
    if (local_3c < 0) {
      uVar8 = local_48 << ((char)local_30[0x100] + (char)local_3c & 0x3fU);
      local_48 = uVar8 | *local_30 >> (-(char)local_3c & 0x1fU);
      uVar3 = (undefined1)(uVar8 >> 0x38);
      if ((local_48 & 0x8080808080808080 & (local_48 + 0x101010101010101 ^ 0xffffffffffffffff)) == 0
         ) {
        *local_250 = uVar3;
        local_250[1] = (char)(local_48 >> 0x30);
        local_250[2] = (char)(local_48 >> 0x28);
        local_250[3] = (char)(local_48 >> 0x20);
        local_250[4] = (char)(local_48 >> 0x18);
        local_250[5] = (char)(local_48 >> 0x10);
        local_250[6] = (char)(local_48 >> 8);
        local_250[7] = (char)local_48;
        local_250 = local_250 + 8;
      }
      else {
        *local_250 = uVar3;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)(((char)(local_48 >> 0x38) != -1) - 2);
        *local_250 = (char)(local_48 >> 0x30);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((ushort)(local_48 >> 0x30) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x28);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x28) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x20);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x20) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x18);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x18) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 0x10);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 0x10) & 0xff) < 0xff) - 2);
        *local_250 = (char)(local_48 >> 8);
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)(local_48 >> 8) & 0xff) < 0xff) - 2);
        *local_250 = (char)local_48;
        local_250[1] = 0;
        local_250 = local_250 + -(long)(int)((((uint)local_48 & 0xff) < 0xff) - 2);
      }
      local_3c = local_3c + 0x40;
      local_48 = (ulong)*local_30;
    }
    else {
      local_48 = local_48 << ((byte)local_30[0x100] & 0x3f) | (ulong)*local_30;
    }
  }
  local_10[2] = local_48;
  *(int *)(local_10 + 3) = local_3c;
  if (0x1ff < uVar2) {
    local_10[1] = local_10[1] - ((long)local_250 - *local_10);
    *local_10 = (long)local_250;
  }
  else {
    local_260 = (long)local_250 - (long)local_248;
    local_250 = local_248;
    for (; local_260 != 0; local_260 = local_260 - local_270) {
      if (local_260 < (ulong)local_10[1]) {
        local_270 = local_260;
      }
      else {
        local_270 = local_10[1];
      }
      memcpy((void *)*local_10,local_250,local_270);
      *local_10 = local_270 + *local_10;
      local_250 = local_250 + local_270;
      local_10[1] = local_10[1] - local_270;
      if ((local_10[1] == 0) && (bVar7 = dump_buffer(in_stack_fffffffffffffd88), bVar7 == 0)) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

LOCAL(boolean)
encode_one_block(working_state *state, JCOEFPTR block, int last_dc_val,
                 c_derived_tbl *dctbl, c_derived_tbl *actbl)
{
  int temp, nbits, free_bits;
  bit_buf_type put_buffer;
  JOCTET _buffer[BUFSIZE], *buffer;
  int localbuf = 0;

  free_bits = state->cur.free_bits;
  put_buffer = state->cur.put_buffer.c;
  LOAD_BUFFER()

  /* Encode the DC coefficient difference per section F.1.2.1 */

  temp = block[0] - last_dc_val;

  /* This is a well-known technique for obtaining the absolute value without a
   * branch.  It is derived from an assembly language technique presented in
   * "How to Optimize for the Pentium Processors", Copyright (c) 1996, 1997 by
   * Agner Fog.  This code assumes we are on a two's complement machine.
   */
  nbits = temp >> (CHAR_BIT * sizeof(int) - 1);
  temp += nbits;
  nbits ^= temp;

  /* Find the number of bits needed for the magnitude of the coefficient */
  nbits = JPEG_NBITS(nbits);

  /* Emit the Huffman-coded symbol for the number of bits.
   * Emit that number of bits of the value, if positive,
   * or the complement of its magnitude, if negative.
   */
  PUT_CODE(dctbl->ehufco[nbits], dctbl->ehufsi[nbits])

  /* Encode the AC coefficients per section F.1.2.2 */

  {
    int r = 0;                  /* r = run length of zeros */

/* Manually unroll the k loop to eliminate the counter variable.  This
 * improves performance greatly on systems with a limited number of
 * registers (such as x86.)
 */
#define kloop(jpeg_natural_order_of_k) { \
  if ((temp = block[jpeg_natural_order_of_k]) == 0) { \
    r += 16; \
  } else { \
    /* Branch-less absolute value, bitwise complement, etc., same as above */ \
    nbits = temp >> (CHAR_BIT * sizeof(int) - 1); \
    temp += nbits; \
    nbits ^= temp; \
    nbits = JPEG_NBITS_NONZERO(nbits); \
    /* if run length > 15, must emit special run-length-16 codes (0xF0) */ \
    while (r >= 16 * 16) { \
      r -= 16 * 16; \
      PUT_BITS(actbl->ehufco[0xf0], actbl->ehufsi[0xf0]) \
    } \
    /* Emit Huffman symbol for run length / number of bits */ \
    r += nbits; \
    PUT_CODE(actbl->ehufco[r], actbl->ehufsi[r]) \
    r = 0; \
  } \
}